

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy.c
# Opt level: O1

_Bool proxy_for_destination(SockAddr *addr,char *hostname,int port,Conf *conf)

{
  _Bool _Var1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  ushort **ppuVar5;
  long lVar6;
  undefined4 in_register_00000014;
  size_t __n;
  uint uVar7;
  long lVar8;
  byte *pbVar9;
  uint uVar10;
  char *__s1;
  ulong uVar11;
  long lVar12;
  char *__s2;
  byte bVar13;
  bool bVar14;
  char hostip [64];
  char local_78 [72];
  
  if ((addr != (SockAddr *)0x0) && (_Var1 = sk_address_is_special_local(addr), _Var1)) {
    return false;
  }
  _Var1 = conf_get_bool((Conf *)CONCAT44(in_register_00000014,port),0xc);
  if (_Var1) {
LAB_001186d3:
    if (addr != (SockAddr *)0x0) {
      sk_getaddr(addr,local_78,0x40);
      sVar3 = strlen(local_78);
      lVar8 = (long)(int)sVar3;
      goto LAB_00118720;
    }
  }
  else {
    _Var1 = sk_hostname_is_local(hostname);
    if (_Var1) {
      return false;
    }
    if (addr != (SockAddr *)0x0) {
      _Var1 = sk_address_is_local(addr);
      if (_Var1) {
        return false;
      }
      goto LAB_001186d3;
    }
  }
  lVar8 = 0;
LAB_00118720:
  sVar3 = strlen(hostname);
  pcVar4 = conf_get_str((Conf *)CONCAT44(in_register_00000014,port),10);
  if (*pcVar4 != '\0') {
    uVar10 = 0;
    while( true ) {
      lVar12 = (long)(int)uVar10;
      uVar11 = (ulong)(byte)pcVar4[lVar12];
      bVar14 = uVar11 == 0;
      if (bVar14) break;
      ppuVar5 = __ctype_b_loc();
      while (((char)uVar11 == ',' || (((*ppuVar5)[uVar11] & 0x2000) != 0))) {
        uVar11 = (ulong)(byte)pcVar4[lVar12 + 1];
        bVar14 = uVar11 == 0;
        if (bVar14) {
          return true;
        }
        lVar12 = lVar12 + 1;
      }
      if (bVar14) {
        return true;
      }
      uVar7 = (uint)lVar12;
      lVar6 = (long)(int)uVar7;
      bVar13 = pcVar4[lVar6];
      uVar10 = uVar7;
      if (bVar13 != 0) {
        ppuVar5 = __ctype_b_loc();
        lVar6 = lVar12;
        do {
          if ((((*ppuVar5)[bVar13] & 8) == 0) &&
             ((0x2e < bVar13 || ((0x640000000000U >> ((ulong)bVar13 & 0x3f) & 1) == 0)))) break;
          uVar10 = uVar10 + 1;
          bVar13 = pcVar4[lVar6 + 1];
          lVar6 = lVar6 + 1;
        } while (bVar13 != 0);
      }
      __s2 = pcVar4 + lVar12;
      if ((char)uVar11 == '*') {
        if ((addr != (SockAddr *)0x0) &&
           (iVar2 = strncasecmp(local_78 + (lVar8 - (int)(~uVar7 + uVar10)),__s2 + 1,
                                (long)(int)(~uVar7 + uVar10)), iVar2 == 0)) {
          return false;
        }
        __n = (size_t)(int)(~uVar7 + uVar10);
        __s2 = __s2 + 1;
        __s1 = hostname + ((long)(int)sVar3 - __n);
      }
      else {
        if (pcVar4[lVar6 + -1] == '*') {
          uVar7 = ~uVar7;
          if ((addr != (SockAddr *)0x0) &&
             (iVar2 = strncasecmp(local_78,__s2,(long)(int)(uVar7 + uVar10)), iVar2 == 0)) {
            return false;
          }
        }
        else {
          if ((addr != (SockAddr *)0x0) &&
             (iVar2 = strncasecmp(local_78,__s2,(long)(int)(uVar10 - uVar7)), iVar2 == 0)) {
            return false;
          }
          uVar7 = -uVar7;
        }
        __n = (size_t)(int)(uVar7 + uVar10);
        __s1 = hostname;
      }
      iVar2 = strncasecmp(__s1,__s2,__n);
      if (iVar2 == 0) {
        return false;
      }
      bVar13 = pcVar4[(int)uVar10];
      if (bVar13 != 0) {
        ppuVar5 = __ctype_b_loc();
        pbVar9 = (byte *)(pcVar4 + (long)(int)uVar10 + 1);
        do {
          if ((bVar13 == 0x2c) || (((*ppuVar5)[bVar13] & 0x2000) != 0)) break;
          uVar10 = uVar10 + 1;
          bVar13 = *pbVar9;
          pbVar9 = pbVar9 + 1;
        } while (bVar13 != 0);
      }
      if (pcVar4[(int)uVar10] == '\0') {
        return true;
      }
    }
  }
  return true;
}

Assistant:

static bool proxy_for_destination(SockAddr *addr, const char *hostname,
                                  int port, Conf *conf)
{
    int s = 0, e = 0;
    char hostip[64];
    int hostip_len, hostname_len;
    const char *exclude_list;

    /*
     * Special local connections such as Unix-domain sockets
     * unconditionally cannot be proxied, even in proxy-localhost
     * mode. There just isn't any way to ask any known proxy type for
     * them.
     */
    if (addr && sk_address_is_special_local(addr))
        return false;                  /* do not proxy */

    /*
     * Check the host name and IP against the hard-coded
     * representations of `localhost'.
     */
    if (!conf_get_bool(conf, CONF_even_proxy_localhost) &&
        (sk_hostname_is_local(hostname) ||
         (addr && sk_address_is_local(addr))))
        return false;                  /* do not proxy */

    /* we want a string representation of the IP address for comparisons */
    if (addr) {
        sk_getaddr(addr, hostip, 64);
        hostip_len = strlen(hostip);
    } else
        hostip_len = 0;                /* placate gcc; shouldn't be required */

    hostname_len = strlen(hostname);

    exclude_list = conf_get_str(conf, CONF_proxy_exclude_list);

    /* now parse the exclude list, and see if either our IP
     * or hostname matches anything in it.
     */

    while (exclude_list[s]) {
        while (exclude_list[s] &&
               (isspace((unsigned char)exclude_list[s]) ||
                exclude_list[s] == ',')) s++;

        if (!exclude_list[s]) break;

        e = s;

        while (exclude_list[e] &&
               (isalnum((unsigned char)exclude_list[e]) ||
                exclude_list[e] == '-' ||
                exclude_list[e] == '.' ||
                exclude_list[e] == '*')) e++;

        if (exclude_list[s] == '*') {
            /* wildcard at beginning of entry */

            if ((addr && strnicmp(hostip + hostip_len - (e - s - 1),
                                  exclude_list + s + 1, e - s - 1) == 0) ||
                strnicmp(hostname + hostname_len - (e - s - 1),
                         exclude_list + s + 1, e - s - 1) == 0) {
                /* IP/hostname range excluded. do not use proxy. */
                return false;
            }
        } else if (exclude_list[e-1] == '*') {
            /* wildcard at end of entry */

            if ((addr && strnicmp(hostip, exclude_list + s, e - s - 1) == 0) ||
                strnicmp(hostname, exclude_list + s, e - s - 1) == 0) {
                /* IP/hostname range excluded. do not use proxy. */
                return false;
            }
        } else {
            /* no wildcard at either end, so let's try an absolute
             * match (ie. a specific IP)
             */

            if (addr && strnicmp(hostip, exclude_list + s, e - s) == 0)
                return false; /* IP/hostname excluded. do not use proxy. */
            if (strnicmp(hostname, exclude_list + s, e - s) == 0)
                return false; /* IP/hostname excluded. do not use proxy. */
        }

        s = e;

        /* Make sure we really have reached the next comma or end-of-string */
        while (exclude_list[s] &&
               !isspace((unsigned char)exclude_list[s]) &&
               exclude_list[s] != ',') s++;
    }

    /* no matches in the exclude list, so use the proxy */
    return true;
}